

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall Syntax::Parser::parse(Parser *this,string *LHS,bool isOnPanicMode)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  Parser *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  Rule *this_01;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer __x;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rulesToProcess;
  string local_b0;
  Parser *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Rule *local_68;
  string *local_60;
  pointer local_58;
  string local_50;
  
  if (this->currentToken == (Token *)0x0) {
    return true;
  }
  bVar4 = Language::Rule::isTerminal(LHS);
  if (bVar4) {
    bVar4 = shouldTakeNext(this,LHS);
    if (bVar4) {
      cVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&KEYWORDS_abi_cxx11_._M_h,LHS);
      if (cVar7.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        Token::getValue_abi_cxx11_(&local_b0,this->currentToken);
        AST::ASTBuilder::push(this->AST_Builder,&local_b0,this->currentToken);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      next(this);
      return true;
    }
  }
  else {
    this_01 = Language::Grammar::getRule(this->grammar,LHS);
    bVar4 = Language::Rule::doesBelongToFirst(this_01,this->currentToken);
    if (bVar4) {
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90 = this;
      local_68 = this_01;
      local_60 = LHS;
      pvVar8 = Language::Rule::getRHS_abi_cxx11_(this_01);
      __x = (pvVar8->
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      local_58 = (pvVar8->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (__x != local_58) {
        bVar4 = false;
        do {
          bVar3 = bVar4;
          if (!bVar4) {
            pbVar9 = (__x->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pbVar10 = (__x->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            if (pbVar9 != pbVar10) {
              do {
                pcVar1 = (pbVar9->_M_dataplus)._M_p;
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b0,pcVar1,pcVar1 + pbVar9->_M_string_length);
                iVar6 = std::__cxx11::string::compare((char *)&local_b0);
                if ((iVar6 == 0) || (*local_b0._M_dataplus._M_p == '@')) {
                  bVar2 = false;
                }
                else {
                  bVar5 = Language::Grammar::shouldTake
                                    (local_90->grammar,&local_b0,local_90->currentToken);
                  bVar2 = true;
                  if (bVar5) {
                    bVar3 = true;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=(&local_88,__x);
                    bVar2 = true;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
                pbVar9 = pbVar9 + 1;
              } while (!bVar2 && pbVar9 != pbVar10);
            }
          }
        } while ((!bVar4) && (__x = __x + 1, bVar4 = bVar3, __x != local_58));
      }
      pbVar9 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = local_90;
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (*(pbVar10->_M_dataplus)._M_p == '@') {
            AST::ASTBuilder::handle(this_00->AST_Builder,pbVar10,local_60);
          }
          else {
            pcVar1 = (pbVar10->_M_dataplus)._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar1,pcVar1 + pbVar10->_M_string_length);
            bVar4 = parse(this_00,&local_50,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (!bVar4) {
              this_00->AST_Builder->isIgnoreModeOn = true;
              printError(this_00,local_68);
              panic(this_00,pbVar10);
            }
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar9);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      return true;
    }
    if (((isOnPanicMode) || (bVar4 = Language::Rule::isNullable(this_01), bVar4)) &&
       (bVar4 = Language::Rule::doesBelongToFollow(this_01,this->currentToken), bVar4)) {
      AST::ASTBuilder::push(this->AST_Builder,LHS,(Token *)0x0);
      return true;
    }
  }
  return false;
}

Assistant:

bool Syntax::Parser::parse(std::string LHS, bool isOnPanicMode) {
    if (currentToken == nullptr && isOnPanicMode) return true;
    if (currentToken == nullptr) return true;

    if (Language::Rule::isTerminal(LHS)) {
        if (shouldTakeNext(LHS)) {
            if (isKeyword(LHS)) {
                std::string value = currentToken->getValue();
                AST_Builder->push(value, currentToken);
            }
            next();
            return true;
        } else return false;
    }

    const Language::Rule *currentRule = grammar->getRule(LHS);
    if (!currentRule->doesBelongToFirst(currentToken)) {
        if ((isOnPanicMode || currentRule->isNullable()) && currentRule->doesBelongToFollow(currentToken)) {
            AST_Builder->push(LHS, nullptr);
            return true;
        } else return false;
    }

    std::vector<std::string> rulesToProcess;
    bool found = false;
    for (auto &production : currentRule->getRHS()) {
        if (found) break;
        for (auto _rule: production) {
            if (_rule != "#" && _rule.front() != '@') {
                if (grammar->shouldTake(_rule, currentToken)) {
                    rulesToProcess = production;
                    found = true;
                    break;
                } else break;
            }
        }
    }

    for (auto &rule: rulesToProcess) {
        if (rule.front() == '@') { // do action
            AST_Builder->handle(rule, LHS);
            continue;
        } else {
            bool result = parse(rule);
            if (!result) {
                AST_Builder->isIgnoreModeOn = true;
                printError(*currentRule);
                panic(rule);
            }
        }
    }

    return true;
}